

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O3

void __thiscall
dxil_spv::CFGStructurizer::hoist_switch_branches_to_frontier
          (CFGStructurizer *this,CFGNode *node,CFGNode *merge,CFGNode *dominance_frontier_candidate)

{
  pointer *pppOVar1;
  CFGNode **__src;
  pointer ppOVar2;
  SPIRVModule *this_00;
  iterator __position;
  pointer ppCVar3;
  pointer pPVar4;
  pointer pIVar5;
  pointer ppOVar6;
  pointer ppOVar7;
  pointer ppOVar8;
  CFGNode *to_prev;
  CFGNode *to;
  Id type_id;
  CFGNode **p;
  CFGNode *insert_node;
  Operation *pOVar9;
  Builder *this_01;
  pointer ppCVar10;
  pointer pCVar11;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  __dest;
  CFGNode *pCVar12;
  pointer pPVar13;
  CFGNode **ppCVar14;
  pointer pIVar15;
  Case *c;
  pointer pCVar16;
  Operation *bor;
  Vector<CFGNode_*> succs;
  Id local_94;
  Operation *local_90;
  CFGNode *local_88;
  uint32_t local_7c;
  CFGNode *local_78;
  pointer local_70;
  vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>> *local_68;
  CFGNode *local_60;
  CFGStructurizer *local_58;
  Operation *local_50;
  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> local_48;
  
  local_78 = dominance_frontier_candidate;
  local_60 = merge;
  insert_node = create_helper_pred_block(this,node);
  ppOVar2 = (insert_node->ir).operations.
            super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ppOVar6 = (node->ir).operations.
            super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppOVar7 = (insert_node->ir).operations.
            super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppOVar8 = (insert_node->ir).operations.
            super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  (insert_node->ir).operations.
  super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (node->ir).operations.
       super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (insert_node->ir).operations.
  super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppOVar6;
  (insert_node->ir).operations.
  super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (node->ir).operations.
       super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (node->ir).operations.
  super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>.
  _M_impl.super__Vector_impl_data._M_start = ppOVar7;
  (node->ir).operations.
  super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppOVar8;
  (node->ir).operations.
  super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = ppOVar2;
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
            (&local_48,&node->succ);
  if (local_48.
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_68 = (vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>> *)
               &(insert_node->ir).operations;
    ppCVar10 = local_48.
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      pCVar12 = *ppCVar10;
      local_88 = pCVar12;
      if ((pCVar12 == local_78) ||
         (((this->reachability_bitset).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start
           [(ulong)(pCVar12->forward_post_visit_order * this->reachability_stride) +
            (ulong)(local_78->forward_post_visit_order >> 5)] >>
           (local_78->forward_post_visit_order & 0x1f) & 1) != 0)) {
        pCVar11 = (node->ir).terminator.cases.
                  super__Vector_base<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pCVar16 = (node->ir).terminator.cases.
                  super__Vector_base<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pCVar11 == pCVar16) {
          local_94 = 0;
        }
        else {
          local_94 = 0;
          local_70 = pCVar16;
          local_58 = this;
          do {
            if (pCVar11->node == pCVar12) {
              pOVar9 = build_switch_case_equal_check(this,node,insert_node,pCVar11);
              if (local_94 == 0) {
                local_94 = pOVar9->id;
              }
              else {
                this_00 = this->module;
                local_50 = pOVar9;
                local_7c = SPIRVModule::allocate_id(this_00);
                this_01 = SPIRVModule::get_builder(this->module);
                type_id = spv::Builder::makeBoolType(this_01);
                local_90 = SPIRVModule::allocate_op(this_00,OpLogicalOr,local_7c,type_id);
                Operation::add_id(local_90,local_94);
                Operation::add_id(local_90,local_50->id);
                __position._M_current =
                     (insert_node->ir).operations.
                     super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (insert_node->ir).operations.
                    super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>>
                  ::_M_realloc_insert<dxil_spv::Operation*const&>(local_68,__position,&local_90);
                }
                else {
                  *__position._M_current = local_90;
                  pppOVar1 = &(insert_node->ir).operations.
                              super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  *pppOVar1 = *pppOVar1 + 1;
                }
                local_94 = local_90->id;
                pCVar16 = local_70;
                this = local_58;
              }
            }
            pCVar11 = pCVar11 + 1;
          } while (pCVar11 != pCVar16);
        }
        to = local_60;
        to_prev = local_78;
        if (pCVar12 == local_78) {
          pPVar4 = (local_78->ir).phi.
                   super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pPVar13 = (local_78->ir).phi.
                         super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>
                         ._M_impl.super__Vector_impl_data._M_start; pPVar13 != pPVar4;
              pPVar13 = pPVar13 + 1) {
            pIVar5 = (pPVar13->incoming).
                     super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pIVar15 = (pPVar13->incoming).
                           super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                           ._M_impl.super__Vector_impl_data._M_start; pIVar15 != pIVar5;
                pIVar15 = pIVar15 + 1) {
              if (pIVar15->block == node) {
                pIVar15->block = insert_node;
              }
            }
          }
        }
        ppCVar3 = (pCVar12->pred).
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppCVar10 = (pCVar12->pred).
                        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppCVar10 != ppCVar3;
            ppCVar10 = ppCVar10 + 1) {
          if (*ppCVar10 == node) {
            *ppCVar10 = insert_node;
          }
        }
        pCVar16 = (node->ir).terminator.cases.
                  super__Vector_base<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pCVar11 = (node->ir).terminator.cases.
                       super__Vector_base<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>
                       ._M_impl.super__Vector_impl_data._M_start; pCVar11 != pCVar16;
            pCVar11 = pCVar11 + 1) {
          if (pCVar11->node == pCVar12) {
            pCVar11->node = local_60;
          }
        }
        __dest = std::
                 __find_if<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<dxil_spv::CFGNode*const>>
                           ((node->succ).
                            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (node->succ).
                            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&local_88);
        __src = __dest._M_current + 1;
        ppCVar14 = (node->succ).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (__src != ppCVar14) {
          memmove(__dest._M_current,__src,(long)ppCVar14 - (long)__src);
          ppCVar14 = (node->succ).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
        (node->succ).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppCVar14 + -1;
        CFGNode::add_branch(node,to);
        CFGNode::add_branch(insert_node,local_88);
        pCVar12 = local_88;
        if (local_88 == to_prev) {
          pCVar12 = CFGNode::rewrite_branch_through_intermediate_node(insert_node,to_prev,to_prev);
        }
        (insert_node->ir).terminator.type = Condition;
        (insert_node->ir).terminator.conditional_id = local_94;
        (insert_node->ir).terminator.true_block = pCVar12;
        (insert_node->ir).terminator.false_block = node;
        (insert_node->ir).terminator.direct_block = (CFGNode *)0x0;
        break;
      }
      ppCVar10 = ppCVar10 + 1;
    } while (ppCVar10 !=
             local_48.
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_48.
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free_in_thread(local_48.
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CFGStructurizer::hoist_switch_branches_to_frontier(CFGNode *node, CFGNode *merge,
                                                        CFGNode *dominance_frontier_candidate)
{
	// Dispatch to the dominance frontier before we enter switch scope.
	auto *pred = create_helper_pred_block(node);
	std::swap(pred->ir.operations, node->ir.operations);

	auto succs = node->succ;
	for (auto *succ : succs)
	{
		if (!query_reachability(*succ, *dominance_frontier_candidate))
			continue;

		// Rewrite the case label to reach merge block in a unique path.
		// That way we can PHI select whether to branch to dominance frontier or not
		// in the switch merge block.

		spv::Id cond_id = 0;
		for (auto &c : node->ir.terminator.cases)
		{
			if (c.node == succ)
			{
				auto *ieq = build_switch_case_equal_check(node, pred, c);

				if (cond_id)
				{
					auto *bor = module.allocate_op(spv::OpLogicalOr, module.allocate_id(),
					                               module.get_builder().makeBoolType());
					bor->add_id(cond_id);
					bor->add_id(ieq->id);
					pred->ir.operations.push_back(bor);
					cond_id = bor->id;
				}
				else
				{
					cond_id = ieq->id;
				}
			}
		}

		if (succ == dominance_frontier_candidate)
		{
			// We're directly branching to target, so might have to rewrite PHI incoming
			// block to pred helper block instead.
			for (auto &phi : dominance_frontier_candidate->ir.phi)
				for (auto &incoming : phi.incoming)
					if (incoming.block == node)
						incoming.block = pred;
		}

		for (auto *&p : succ->pred)
			if (p == node)
				p = pred;

		for (auto &c : node->ir.terminator.cases)
			if (c.node == succ)
				c.node = merge;

		node->succ.erase(std::find(node->succ.begin(), node->succ.end(), succ));
		node->add_branch(merge);
		pred->add_branch(succ);

		// Make sure that our selection branch has somewhere to merge if it has to.
		if (succ == dominance_frontier_candidate)
		{
			succ = pred->rewrite_branch_through_intermediate_node(dominance_frontier_candidate,
			                                                      dominance_frontier_candidate);
		}

		pred->ir.terminator.type = Terminator::Type::Condition;
		pred->ir.terminator.conditional_id = cond_id;
		pred->ir.terminator.true_block = succ;
		pred->ir.terminator.false_block = node;
		pred->ir.terminator.direct_block = nullptr;

		// Have to assume that there is only one path to this frontier,
		// otherwise we're in a world of impossible case merges
		// which should have been handled elsewhere ...
		return;
	}
}